

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_dynamic.cpp
# Opt level: O3

void multikey_dynamic<vector_brodnik<unsigned_char*>,unsigned_int>
               (uchar **strings,size_t N,size_t depth)

{
  uchar **ppuVar1;
  uint j;
  uint uVar2;
  uchar *puVar3;
  pointer pppuVar4;
  uint uVar5;
  size_t sVar6;
  pointer pppuVar7;
  long lVar8;
  vector_brodnik<unsigned_char_*> *this;
  uchar **ppuVar9;
  long lVar10;
  size_t sVar11;
  long lVar12;
  byte bVar13;
  uint j_1;
  long lVar14;
  size_t sVar15;
  ulong uVar16;
  ulong uVar17;
  array<vector_brodnik<unsigned_char_*>,_3UL> buckets;
  array<unsigned_int,_32UL> cache;
  long local_1b8;
  long local_1b0;
  vector_brodnik<unsigned_char_*> local_178;
  vector_brodnik<unsigned_char_*> local_140;
  vector_brodnik<unsigned_char_*> local_108;
  ulong local_d0;
  size_t local_c8;
  long local_c0;
  long local_b8;
  uint auStack_b0 [32];
  
  if (N < 10000) {
    mkqsort(strings,(int)N,(int)depth);
    return;
  }
  lVar14 = 0;
  do {
    this = (vector_brodnik<unsigned_char_*> *)
           ((long)&local_178._index_block.
                   super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar14);
    (this->_index_block).super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    *(undefined8 *)
     ((long)&local_178._index_block.
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_finish + lVar14) = 0;
    *(undefined8 *)
     ((long)&local_178._index_block.
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + lVar14) = 0;
    vector_brodnik<unsigned_char_*>::clear(this);
    lVar14 = lVar14 + 0x38;
  } while (lVar14 != 0xa8);
  uVar2 = pseudo_median<unsigned_int>(strings,N,depth);
  if ((N & 0xffffffffffffffe0) == 0) {
    sVar11 = 0;
  }
  else {
    sVar11 = 0;
    ppuVar9 = strings;
    do {
      lVar14 = 0;
      do {
        puVar3 = ppuVar9[lVar14];
        if (puVar3 == (uchar *)0x0) goto LAB_0021e4e8;
        bVar13 = puVar3[depth];
        if (bVar13 == 0) {
          uVar5 = 0;
        }
        else {
          uVar5 = (uint)bVar13 << 0x18;
          if (puVar3[depth + 1] != 0) {
            uVar5 = (uint)bVar13 << 0x18 | (uint)puVar3[depth + 1] << 0x10;
            if (puVar3[depth + 2] != '\0') {
              uVar5 = uVar5 | CONCAT11(puVar3[depth + 2],puVar3[depth + 3]);
            }
          }
        }
        auStack_b0[lVar14] = uVar5;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0x20);
      lVar14 = 0;
      do {
        uVar5 = auStack_b0[lVar14];
        lVar8 = (ulong)(uVar5 == uVar2) + (ulong)(uVar2 <= uVar5 && uVar5 != uVar2) * 2;
        sVar15 = (&local_178)[lVar8]._left_in_block;
        if (sVar15 == 0) {
          vector_brodnik<unsigned_char_*>::grow(&local_178 + lVar8);
          sVar15 = (&local_178)[lVar8]._left_in_block;
        }
        puVar3 = ppuVar9[lVar14];
        ppuVar1 = (&local_178)[lVar8]._insertpos;
        (&local_178)[lVar8]._insertpos = ppuVar1 + 1;
        *ppuVar1 = puVar3;
        (&local_178)[lVar8]._left_in_block = sVar15 - 1;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0x20);
      sVar11 = sVar11 + 0x20;
      ppuVar9 = ppuVar9 + 0x20;
    } while (sVar11 < (N & 0xffffffffffffffe0));
  }
  if (sVar11 < N) {
    do {
      puVar3 = strings[sVar11];
      if (puVar3 == (uchar *)0x0) {
LAB_0021e4e8:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x38,"uint32_t get_char(unsigned char *, size_t)");
      }
      if (puVar3[depth] == 0) {
        uVar5 = 0;
      }
      else {
        uVar5 = (uint)puVar3[depth] << 0x18;
        if (puVar3[depth + 1] != 0) {
          uVar5 = uVar5 | (uint)puVar3[depth + 1] << 0x10;
          if (puVar3[depth + 2] != '\0') {
            uVar5 = uVar5 | CONCAT11(puVar3[depth + 2],puVar3[depth + 3]);
          }
        }
      }
      lVar14 = (ulong)(uVar5 == uVar2) + (ulong)(uVar2 <= uVar5 && uVar5 != uVar2) * 2;
      sVar15 = (&local_178)[lVar14]._left_in_block;
      if (sVar15 == 0) {
        vector_brodnik<unsigned_char_*>::grow(&local_178 + lVar14);
        sVar15 = (&local_178)[lVar14]._left_in_block;
        puVar3 = strings[sVar11];
      }
      ppuVar9 = (&local_178)[lVar14]._insertpos;
      (&local_178)[lVar14]._insertpos = ppuVar9 + 1;
      *ppuVar9 = puVar3;
      (&local_178)[lVar14]._left_in_block = sVar15 - 1;
      sVar11 = sVar11 + 1;
    } while (N != sVar11);
  }
  lVar8 = (long)(2 << (local_178._superblock & 0x1f)) + -0x40;
  lVar14 = local_178._left_in_superblock * local_178._block_size + local_178._left_in_block;
  sVar15 = lVar8 - lVar14;
  lVar12 = local_140._left_in_superblock * local_140._block_size + local_140._left_in_block;
  lVar10 = (long)(2 << (local_140._superblock & 0x1f)) + -0x40;
  sVar11 = lVar10 - lVar12;
  local_c0 = (long)(2 << (local_108._superblock & 0x1f)) + -0x40;
  local_b8 = local_108._left_in_superblock * local_108._block_size + local_108._left_in_block;
  local_c8 = local_c0 - local_b8;
  if (sVar11 + sVar15 + local_c8 != N) {
    __assert_fail("bucketsize0 + bucketsize1 + bucketsize2 == N",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_dynamic.cpp"
                  ,0x5d,
                  "void multikey_dynamic(unsigned char **, size_t, size_t) [BucketT = vector_brodnik<unsigned char *>, CharT = unsigned int]"
                 );
  }
  if (lVar8 != lVar14) {
    pppuVar4 = local_178._index_block.
               super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
               super__Vector_impl_data._M_finish;
    ppuVar9 = strings;
    if (local_178._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_178._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_1b8 = 8;
      uVar16 = 0;
      lVar14 = 8;
      bVar13 = 0;
      pppuVar7 = local_178._index_block.
                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 super__Vector_impl_data._M_start;
      do {
        uVar17 = uVar16;
        if (lVar14 != 0) {
          lVar8 = lVar14;
          local_d0 = uVar16;
          do {
            pppuVar4 = local_178._index_block.
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            if (uVar16 == ((long)local_178._index_block.
                                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_178._index_block.
                                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) - 1U)
            goto LAB_0021e1d6;
            if (local_1b8 != 0) {
              memmove(ppuVar9,local_178._index_block.
                              super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar16],local_1b8 * 8);
            }
            uVar16 = uVar16 + 1;
            ppuVar9 = ppuVar9 + local_1b8;
            lVar8 = lVar8 + -1;
            pppuVar4 = local_178._index_block.
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            uVar17 = local_d0;
            pppuVar7 = local_178._index_block.
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_start;
          } while (lVar8 != 0);
        }
        uVar16 = uVar17 + lVar14;
        lVar14 = lVar14 << bVar13;
        bVar13 = bVar13 ^ 1;
        local_1b8 = local_1b8 << bVar13;
      } while (uVar16 < (ulong)((long)pppuVar4 - (long)pppuVar7 >> 3));
    }
LAB_0021e1d6:
    sVar6 = (long)local_178._insertpos - (long)pppuVar4[-1];
    if (sVar6 != 0) {
      memmove(ppuVar9,pppuVar4[-1],sVar6);
    }
  }
  if (lVar10 != lVar12) {
    ppuVar9 = strings + sVar15;
    pppuVar4 = local_140._index_block.
               super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
               super__Vector_impl_data._M_finish;
    if (local_140._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_140._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_1b0 = 8;
      uVar16 = 0;
      lVar14 = 8;
      bVar13 = 0;
      pppuVar7 = local_140._index_block.
                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 super__Vector_impl_data._M_start;
      do {
        if (lVar14 != 0) {
          lVar8 = lVar14;
          uVar17 = uVar16;
          do {
            pppuVar4 = local_140._index_block.
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            if (uVar17 == ((long)local_140._index_block.
                                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_140._index_block.
                                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) - 1U)
            goto LAB_0021e2ec;
            if (local_1b0 != 0) {
              memmove(ppuVar9,local_140._index_block.
                              super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar17],local_1b0 * 8);
            }
            uVar17 = uVar17 + 1;
            ppuVar9 = ppuVar9 + local_1b0;
            lVar8 = lVar8 + -1;
            pppuVar4 = local_140._index_block.
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            pppuVar7 = local_140._index_block.
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_start;
          } while (lVar8 != 0);
        }
        uVar16 = uVar16 + lVar14;
        lVar14 = lVar14 << bVar13;
        bVar13 = bVar13 ^ 1;
        local_1b0 = local_1b0 << bVar13;
      } while (uVar16 < (ulong)((long)pppuVar4 - (long)pppuVar7 >> 3));
    }
LAB_0021e2ec:
    sVar6 = (long)local_140._insertpos - (long)pppuVar4[-1];
    if (sVar6 != 0) {
      memmove(ppuVar9,pppuVar4[-1],sVar6);
    }
  }
  if (local_c0 != local_b8) {
    ppuVar9 = strings + sVar15 + sVar11;
    pppuVar4 = local_108._index_block.
               super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
               super__Vector_impl_data._M_finish;
    if (local_108._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_108._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_1b0 = 8;
      uVar16 = 0;
      lVar14 = 8;
      bVar13 = 0;
      pppuVar7 = local_108._index_block.
                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 super__Vector_impl_data._M_start;
      do {
        if (lVar14 != 0) {
          lVar8 = lVar14;
          uVar17 = uVar16;
          do {
            pppuVar4 = local_108._index_block.
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            if (uVar17 == ((long)local_108._index_block.
                                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_108._index_block.
                                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) - 1U)
            goto LAB_0021e448;
            if (local_1b0 != 0) {
              memmove(ppuVar9,local_108._index_block.
                              super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar17],local_1b0 * 8);
            }
            uVar17 = uVar17 + 1;
            ppuVar9 = ppuVar9 + local_1b0;
            lVar8 = lVar8 + -1;
            pppuVar4 = local_108._index_block.
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            pppuVar7 = local_108._index_block.
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_start;
          } while (lVar8 != 0);
        }
        uVar16 = uVar16 + lVar14;
        lVar14 = lVar14 << bVar13;
        bVar13 = bVar13 ^ 1;
        local_1b0 = local_1b0 << bVar13;
      } while (uVar16 < (ulong)((long)pppuVar4 - (long)pppuVar7 >> 3));
    }
LAB_0021e448:
    sVar6 = (long)local_108._insertpos - (long)pppuVar4[-1];
    if (sVar6 != 0) {
      memmove(ppuVar9,pppuVar4[-1],sVar6);
    }
  }
  vector_brodnik<unsigned_char_*>::clear(&local_178);
  vector_brodnik<unsigned_char_*>::clear(&local_140);
  vector_brodnik<unsigned_char_*>::clear(&local_108);
  multikey_dynamic<vector_brodnik<unsigned_char*>,unsigned_int>(strings,sVar15,depth);
  if ((char)uVar2 != '\0') {
    multikey_dynamic<vector_brodnik<unsigned_char*>,unsigned_int>(strings + sVar15,sVar11,depth + 4)
    ;
  }
  multikey_dynamic<vector_brodnik<unsigned_char*>,unsigned_int>
            (strings + sVar15 + sVar11,local_c8,depth);
  lVar14 = 0x70;
  do {
    vector_brodnik<unsigned_char_*>::~vector_brodnik
              ((vector_brodnik<unsigned_char_*> *)
               ((long)&local_178._index_block.
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar14));
    lVar14 = lVar14 + -0x38;
  } while (lVar14 != -0x38);
  return;
}

Assistant:

static void
multikey_dynamic(unsigned char** strings, size_t N, size_t depth)
{
	if (N < 10000) {
		mkqsort(strings, N, depth);
		return;
	}
	std::array<BucketT, 3> buckets;
	CharT partval = pseudo_median<CharT>(strings, N, depth);
	// Use a small cache to reduce memory stalls.
	size_t i=0;
	for (; i < N-N%32; i+=32) {
		std::array<CharT, 32> cache;
		for (unsigned j=0; j<32; ++j) {
			cache[j] = get_char<CharT>(strings[i+j], depth);
		}
		for (unsigned j=0; j<32; ++j) {
			const unsigned b = get_bucket(cache[j], partval);
			buckets[b].push_back(strings[i+j]);
		}
	}
	for (; i < N; ++i) {
		const CharT c = get_char<CharT>(strings[i], depth);
		const unsigned b = get_bucket(c, partval);
		buckets[b].push_back(strings[i]);
	}
	const size_t bucketsize0 = buckets[0].size();
	const size_t bucketsize1 = buckets[1].size();
	const size_t bucketsize2 = buckets[2].size();
	assert(bucketsize0 + bucketsize1 + bucketsize2 == N);
	if (bucketsize0) copy(buckets[0], strings);
	if (bucketsize1) copy(buckets[1], strings+bucketsize0);
	if (bucketsize2) copy(buckets[2], strings+bucketsize0+bucketsize1);
	clear_bucket(buckets[0]);
	clear_bucket(buckets[1]);
	clear_bucket(buckets[2]);
	multikey_dynamic<BucketT, CharT>(strings, bucketsize0, depth);
	if (not is_end(partval))
		multikey_dynamic<BucketT, CharT>(strings+bucketsize0,
				bucketsize1, depth+sizeof(CharT));
	multikey_dynamic<BucketT, CharT>(strings+bucketsize0+bucketsize1,
			bucketsize2, depth);
}